

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::Run(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  FlagSaver fs;
  string filename;
  FlagSaver FStack_58;
  string local_50;
  string local_30;
  
  FlagSaver::FlagSaver(&FStack_58);
  fprintf(_stderr,"Running test %s/%s\n","DeprecatedFunctionsTest","ReadFromFlagsFile");
  fLI::FLAGS_test_int32 = -10;
  paVar1 = &local_30.field_2;
  local_30.field_2._M_allocated_capacity = 0x656c696667616c66;
  local_30.field_2._8_2_ = 0x32;
  local_30._M_string_length = 9;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  TmpFile(&local_50,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  unlink(local_50._M_dataplus._M_p);
  pcVar3 = GetArgv0();
  bVar2 = AppendFlagsIntoFile(&local_50,pcVar3);
  if (bVar2) {
    fLI::FLAGS_test_int32 = -0xb;
    pcVar3 = GetArgv0();
    bVar2 = ReadFromFlagsFile(&local_50,pcVar3,true);
    if (bVar2) {
      if (fLI::FLAGS_test_int32 == -10) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        FlagSaver::~FlagSaver(&FStack_58);
        return;
      }
      goto LAB_00139af3;
    }
  }
  else {
    _GLOBAL__N_1::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::Run();
  }
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::Run();
LAB_00139af3:
  _GLOBAL__N_1::Test_DeprecatedFunctionsTest_ReadFromFlagsFile::Run();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  FlagSaver::~FlagSaver(&FStack_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(DeprecatedFunctionsTest, ReadFromFlagsFile) {
  FLAGS_test_int32 = -10;    // just to make the test more interesting
  string filename(TmpFile("flagfile2"));
  unlink(filename.c_str());  // just to be safe
  bool r = AppendFlagsIntoFile(filename, GetArgv0());
  EXPECT_TRUE(r);

  FLAGS_test_int32 = -11;
  r = ReadFromFlagsFile(filename, GetArgv0(), true);
  EXPECT_TRUE(r);
  EXPECT_EQ(-10, FLAGS_test_int32);
}